

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::TestParsingMergeLite::ByteSizeLong(TestParsingMergeLite *this)

{
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *this_00;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup> *this_01;
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  void **ppvVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  size_t sVar7;
  long lVar8;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  lVar8 = (long)*(int *)((long)&this->field_0 + 0x28) + sVar3;
  this_00 = &(this->field_0)._impl_.repeated_all_types_;
  ppvVar4 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar5 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(this_00);
  for (; ppvVar4 != cVar5.it_; ppvVar4 = ppvVar4 + 1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>((TestAllTypesLite *)*ppvVar4);
    lVar8 = lVar8 + sVar3;
  }
  sVar3 = lVar8 + (long)*(int *)((long)&this->field_0 + 0x40) * 4;
  this_01 = &(this->field_0)._impl_.repeatedgroup_;
  ppvVar4 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_01->super_RepeatedPtrFieldBase);
  cVar6 = google::protobuf::RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedGroup>::
          end(this_01);
  for (; ppvVar4 != cVar6.it_; ppvVar4 = ppvVar4 + 1) {
    sVar7 = TestParsingMergeLite_RepeatedGroup::ByteSizeLong
                      ((TestParsingMergeLite_RepeatedGroup *)*ppvVar4);
    sVar3 = sVar3 + sVar7;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 1) != 0) {
    sVar7 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>
                      ((this->field_0)._impl_.required_all_types_);
    sVar3 = sVar3 + sVar7 + 1;
  }
  if ((uVar1 & 6) != 0) {
    if ((uVar1 & 2) != 0) {
      sVar7 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestAllTypesLite>
                        ((this->field_0)._impl_.optional_all_types_);
      sVar3 = sVar3 + sVar7 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar7 = TestParsingMergeLite_OptionalGroup::ByteSizeLong
                        ((this->field_0)._impl_.optionalgroup_);
      sVar3 = sVar3 + sVar7 + 2;
    }
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar2 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar3 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar3;
  }
  return sVar3;
}

Assistant:

::size_t TestParsingMergeLite::ByteSizeLong() const {
  const TestParsingMergeLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestParsingMergeLite)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.TestAllTypesLite repeated_all_types = 3;
    {
      total_size += 1UL * this_._internal_repeated_all_types_size();
      for (const auto& msg : this_._internal_repeated_all_types()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestParsingMergeLite.RepeatedGroup repeatedgroup = 20 [features = {
    {
      total_size += 4UL * this_._internal_repeatedgroup_size();
      for (const auto& msg : this_._internal_repeatedgroup()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
  }
   {
    // .proto2_unittest.TestAllTypesLite required_all_types = 1 [features = {
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.required_all_types_);
    }
  }
  if ((cached_has_bits & 0x00000006u) != 0) {
    // .proto2_unittest.TestAllTypesLite optional_all_types = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_all_types_);
    }
    // .proto2_unittest.TestParsingMergeLite.OptionalGroup optionalgroup = 10 [features = {
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}